

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O0

void __thiscall
chrono::ChFrameMoving<double>::ChFrameMoving(ChFrameMoving<double> *this,ChFrame<double> *mc)

{
  ChQuaternion<double> *other;
  ChQuaternion<double> local_48;
  ChFrame<double> *local_18;
  ChFrame<double> *mc_local;
  ChFrameMoving<double> *this_local;
  
  local_18 = mc;
  mc_local = &this->super_ChFrame<double>;
  ChFrame<double>::ChFrame(&this->super_ChFrame<double>,mc);
  (this->super_ChFrame<double>)._vptr_ChFrame = (_func_int **)&PTR__ChFrameMoving_0014fc08;
  ChCoordsys<double>::ChCoordsys(&this->coord_dt);
  ChCoordsys<double>::ChCoordsys(&this->coord_dtdt);
  ChQuaternion<double>::ChQuaternion(&local_48,0.0,0.0,0.0,0.0);
  other = ChQuaternion<double>::operator=(&(this->coord_dtdt).rot,&local_48);
  ChQuaternion<double>::operator=(&(this->coord_dt).rot,other);
  return;
}

Assistant:

explicit ChFrameMoving(const ChFrame<Real>& mc) : ChFrame<Real>(mc) {
        coord_dt.rot = coord_dtdt.rot = ChQuaternion<Real>(0, 0, 0, 0);
    }